

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O2

void __thiscall
cbtAxisSweep3Internal<unsigned_int>::cbtAxisSweep3Internal
          (cbtAxisSweep3Internal<unsigned_int> *this,cbtVector3 *worldAabbMin,
          cbtVector3 *worldAabbMax,uint handleMask,uint handleSentinel,uint userMaxHandles,
          cbtOverlappingPairCache *pairCache,bool disableRaycastAccelerator)

{
  Edge *pEVar1;
  undefined1 auVar2 [32];
  undefined8 uVar3;
  cbtHashedOverlappingPairCache *this_00;
  cbtOverlappingPairCache *pcVar4;
  cbtDbvtBroadphase *this_01;
  Handle *pHVar5;
  Handle *pHVar6;
  undefined4 *puVar7;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [56];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar20 [16];
  cbtVector3 cVar21;
  
  auVar19 = in_ZMM2._0_16_;
  (this->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface =
       (_func_int **)&PTR__cbtAxisSweep3Internal_011932d0;
  this->m_bpHandleMask = handleMask;
  this->m_handleSentinel = handleSentinel;
  this->m_pairCache = pairCache;
  this->m_userPairCallback = (cbtOverlappingPairCallback *)0x0;
  this->m_ownsPairCache = false;
  this->m_invalidPair = 0;
  this->m_raycastAccelerator = (cbtDbvtBroadphase *)0x0;
  if (pairCache == (cbtOverlappingPairCache *)0x0) {
    this_00 = (cbtHashedOverlappingPairCache *)cbtAlignedAllocInternal(0x78,0x10);
    cbtHashedOverlappingPairCache::cbtHashedOverlappingPairCache(this_00);
    this->m_pairCache = (cbtOverlappingPairCache *)this_00;
    this->m_ownsPairCache = true;
  }
  uVar11 = userMaxHandles + 1;
  if (!disableRaycastAccelerator) {
    pcVar4 = (cbtOverlappingPairCache *)cbtAlignedAllocInternal(0x28,0x10);
    pcVar4[1].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar4[2].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar4[3].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar4[4].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    (pcVar4->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback =
         (_func_int **)&PTR__cbtNullPairCache_011931f0;
    *(undefined1 *)&pcVar4[4].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = 1;
    *(undefined4 *)
     ((long)&pcVar4[1].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback + 4) = 0;
    this->m_nullPairCache = pcVar4;
    this_01 = (cbtDbvtBroadphase *)cbtAlignedAllocInternal(0x100,0x10);
    cbtDbvtBroadphase::cbtDbvtBroadphase(this_01,this->m_nullPairCache);
    this->m_raycastAccelerator = this_01;
    this_01->m_deferedcollide = true;
  }
  uVar3 = *(undefined8 *)(worldAabbMin->m_floats + 2);
  *(undefined8 *)(this->m_worldAabbMin).m_floats = *(undefined8 *)worldAabbMin->m_floats;
  *(undefined8 *)((this->m_worldAabbMin).m_floats + 2) = uVar3;
  uVar12 = *(ulong *)(worldAabbMax->m_floats + 2);
  auVar16 = ZEXT856(uVar12);
  *(undefined8 *)(this->m_worldAabbMax).m_floats = *(undefined8 *)worldAabbMax->m_floats;
  *(ulong *)((this->m_worldAabbMax).m_floats + 2) = uVar12;
  cVar21 = ::operator-(&this->m_worldAabbMax,&this->m_worldAabbMin);
  auVar13._0_8_ = cVar21.m_floats._0_8_;
  auVar13._8_56_ = auVar16;
  auVar19 = vcvtusi2ss_avx512f(auVar19,this->m_handleSentinel);
  uVar12 = (ulong)uVar11;
  fVar18 = auVar19._0_4_;
  auVar20._4_4_ = fVar18;
  auVar20._0_4_ = fVar18;
  auVar20._8_4_ = fVar18;
  auVar20._12_4_ = fVar18;
  auVar17._0_4_ = fVar18 / cVar21.m_floats[2];
  auVar17._4_12_ = auVar19._4_12_;
  auVar19 = vdivps_avx(auVar20,auVar13._0_16_);
  auVar19 = vinsertps_avx(auVar19,auVar17,0x28);
  *(undefined1 (*) [16])(this->m_quantize).m_floats = auVar19;
  pHVar5 = (Handle *)Handle::operator_new__(uVar12 * 0x58);
  if (uVar11 != 0) {
    uVar9 = 0;
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar2 = vpmovsxwd_avx2(_DAT_00f5c290);
    auVar14 = vpbroadcastq_avx512f();
    pHVar6 = pHVar5;
    do {
      auVar15 = vpbroadcastq_avx512f();
      uVar9 = uVar9 + 8;
      auVar15 = vporq_avx512f(auVar15,auVar13);
      uVar3 = vpcmpuq_avx512f(auVar15,auVar14,2);
      vpscatterdq_avx512f(ZEXT864(pHVar6) + ZEXT3264(auVar2),uVar3,ZEXT1664(ZEXT816(0) << 0x40));
      pHVar6 = pHVar6 + 8;
    } while (((uVar12 * 0x58 - 0x58) / 0x58 + 8 & 0x7fffffffffffff8) != uVar9);
  }
  this->m_pHandles = pHVar5;
  this->m_maxHandles = uVar11;
  this->m_numHandles = 0;
  puVar7 = (undefined4 *)&pHVar5[1].super_cbtBroadphaseProxy.field_0x34;
  this->m_firstFreeHandle = 1;
  uVar9 = 1;
  while (uVar9 < uVar12) {
    uVar9 = uVar9 + 1;
    *puVar7 = (int)uVar9;
    puVar7 = puVar7 + 0x16;
  }
  *(undefined4 *)&pHVar5[userMaxHandles].super_cbtBroadphaseProxy.field_0x34 = 0;
  for (lVar10 = -0x18; lVar10 != 0; lVar10 = lVar10 + 8) {
    pvVar8 = cbtAlignedAllocInternal(uVar12 << 4,0x10);
    *(void **)((long)this->m_pEdgesRawPtr + lVar10 + 0x18) = pvVar8;
    *(void **)((long)this->m_pEdgesRawPtr + lVar10) = pvVar8;
  }
  pHVar5 = this->m_pHandles;
  (pHVar5->super_cbtBroadphaseProxy).m_clientObject = (void *)0x0;
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    *(undefined4 *)((long)(&(pHVar5->super_cbtBroadphaseProxy).m_aabbMax + 1) + lVar10 * 4) = 0;
    pHVar5->m_maxEdges[lVar10] = 1;
    pEVar1 = this->m_pEdges[lVar10];
    pEVar1->m_pos = 0;
    pEVar1->m_handle = 0;
    pEVar1[1].m_pos = this->m_handleSentinel;
    pEVar1[1].m_handle = 0;
  }
  return;
}

Assistant:

cbtAxisSweep3Internal<BP_FP_INT_TYPE>::cbtAxisSweep3Internal(const cbtVector3& worldAabbMin, const cbtVector3& worldAabbMax, BP_FP_INT_TYPE handleMask, BP_FP_INT_TYPE handleSentinel, BP_FP_INT_TYPE userMaxHandles, cbtOverlappingPairCache* pairCache, bool disableRaycastAccelerator)
	: m_bpHandleMask(handleMask),
	  m_handleSentinel(handleSentinel),
	  m_pairCache(pairCache),
	  m_userPairCallback(0),
	  m_ownsPairCache(false),
	  m_invalidPair(0),
	  m_raycastAccelerator(0)
{
	BP_FP_INT_TYPE maxHandles = static_cast<BP_FP_INT_TYPE>(userMaxHandles + 1);  //need to add one sentinel handle

	if (!m_pairCache)
	{
		void* ptr = cbtAlignedAlloc(sizeof(cbtHashedOverlappingPairCache), 16);
		m_pairCache = new (ptr) cbtHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	if (!disableRaycastAccelerator)
	{
		m_nullPairCache = new (cbtAlignedAlloc(sizeof(cbtNullPairCache), 16)) cbtNullPairCache();
		m_raycastAccelerator = new (cbtAlignedAlloc(sizeof(cbtDbvtBroadphase), 16)) cbtDbvtBroadphase(m_nullPairCache);  //m_pairCache);
		m_raycastAccelerator->m_deferedcollide = true;                                                                //don't add/remove pairs
	}

	//cbtAssert(bounds.HasVolume());

	// init bounds
	m_worldAabbMin = worldAabbMin;
	m_worldAabbMax = worldAabbMax;

	cbtVector3 aabbSize = m_worldAabbMax - m_worldAabbMin;

	BP_FP_INT_TYPE maxInt = m_handleSentinel;

	m_quantize = cbtVector3(cbtScalar(maxInt), cbtScalar(maxInt), cbtScalar(maxInt)) / aabbSize;

	// allocate handles buffer, using cbtAlignedAlloc, and put all handles on free list
	m_pHandles = new Handle[maxHandles];

	m_maxHandles = maxHandles;
	m_numHandles = 0;

	// handle 0 is reserved as the null index, and is also used as the sentinel
	m_firstFreeHandle = 1;
	{
		for (BP_FP_INT_TYPE i = m_firstFreeHandle; i < maxHandles; i++)
			m_pHandles[i].SetNextFree(static_cast<BP_FP_INT_TYPE>(i + 1));
		m_pHandles[maxHandles - 1].SetNextFree(0);
	}

	{
		// allocate edge buffers
		for (int i = 0; i < 3; i++)
		{
			m_pEdgesRawPtr[i] = cbtAlignedAlloc(sizeof(Edge) * maxHandles * 2, 16);
			m_pEdges[i] = new (m_pEdgesRawPtr[i]) Edge[maxHandles * 2];
		}
	}
	//removed overlap management

	// make boundary sentinels

	m_pHandles[0].m_clientObject = 0;

	for (int axis = 0; axis < 3; axis++)
	{
		m_pHandles[0].m_minEdges[axis] = 0;
		m_pHandles[0].m_maxEdges[axis] = 1;

		m_pEdges[axis][0].m_pos = 0;
		m_pEdges[axis][0].m_handle = 0;
		m_pEdges[axis][1].m_pos = m_handleSentinel;
		m_pEdges[axis][1].m_handle = 0;
#ifdef DEBUG_BROADPHASE
		debugPrintAxis(axis);
#endif  //DEBUG_BROADPHASE
	}
}